

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csat_apis.c
# Opt level: O3

void ABC_Network_Finalize(ABC_Manager mng)

{
  Abc_Ntk_t *pAVar1;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  
  pAVar1 = mng->pNtk;
  pVVar4 = pAVar1->vPis;
  if (0 < pVVar4->nSize) {
    lVar5 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar4->pArray[lVar5];
      pcVar3 = ABC_GetNodeName((ABC_Manager)mng->tNode2Name,pAVar2);
      Abc_ObjAssignName(pAVar2,pcVar3,(char *)0x0);
      lVar5 = lVar5 + 1;
      pVVar4 = pAVar1->vPis;
    } while (lVar5 < pVVar4->nSize);
  }
  pVVar4 = pAVar1->vPos;
  if (0 < pVVar4->nSize) {
    lVar5 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar4->pArray[lVar5];
      pcVar3 = ABC_GetNodeName((ABC_Manager)mng->tNode2Name,pAVar2);
      Abc_ObjAssignName(pAVar2,pcVar3,(char *)0x0);
      lVar5 = lVar5 + 1;
      pVVar4 = pAVar1->vPos;
    } while (lVar5 < pVVar4->nSize);
  }
  if (pAVar1->nObjCounts[8] == 0) {
    return;
  }
  __assert_fail("Abc_NtkLatchNum(pNtk) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/csat/csat_apis.c"
                ,0x13d,"void ABC_Network_Finalize(ABC_Manager)");
}

Assistant:

void ABC_Network_Finalize( ABC_Manager mng )
{
    Abc_Ntk_t * pNtk = mng->pNtk;
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_ObjAssignName( pObj, ABC_GetNodeName(mng, pObj), NULL );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_ObjAssignName( pObj, ABC_GetNodeName(mng, pObj), NULL );
    assert( Abc_NtkLatchNum(pNtk) == 0 );
}